

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

natwm_error client_configure_window(natwm_state *state,xcb_configure_request_event_t *event)

{
  workspace *workspace_00;
  client *client_00;
  monitor *monitor_00;
  xcb_rectangle_t xVar1;
  undefined1 local_5c [8];
  xcb_configure_request_event_t new_event;
  xcb_rectangle_t new_rect;
  monitor *monitor;
  client *client;
  workspace *workspace;
  xcb_configure_request_event_t *event_local;
  natwm_state *state_local;
  
  workspace_00 = workspace_list_find_window_workspace(state->workspace_list,event->window);
  if (workspace_00 != (workspace *)0x0) {
    client_00 = workspace_find_window_client(workspace_00,event->window);
    monitor_00 = monitor_list_get_workspace_monitor(state->monitor_list,workspace_00);
    if ((client_00 == (client *)0x0) || (monitor_00 == (monitor *)0x0)) {
      return RESOLUTION_FAILURE;
    }
    new_event._20_8_ = client_00->rect;
    local_5c[0] = event->response_type;
    local_5c[1] = event->stack_mode;
    local_5c._2_2_ = event->sequence;
    local_5c._4_4_ = event->parent;
    new_event._0_8_ = *(undefined8 *)&event->window;
    new_event._8_8_ = *(undefined8 *)&event->x;
    new_event.x = event->border_width;
    new_event.y = event->value_mask;
    if ((event->value_mask & 1) != 0) {
      new_event.width = event->x;
    }
    if ((event->value_mask & 2) != 0) {
      new_event.height = event->y;
    }
    if ((event->value_mask & 4) != 0) {
      if ((int)(uint)event->width < client_00->size_hints->min_width) {
        new_event.border_width = (uint16_t)client_00->size_hints->min_width;
      }
      else if (client_00->size_hints->max_width < (int)(uint)event->width) {
        new_event.border_width = (uint16_t)client_00->size_hints->max_width;
      }
      else {
        new_event.border_width = event->width;
      }
    }
    if ((event->value_mask & 8) != 0) {
      if ((int)(uint)event->height < client_00->size_hints->min_height) {
        new_event.value_mask = (uint16_t)client_00->size_hints->min_height;
      }
      else if (client_00->size_hints->max_height < (int)(uint)event->height) {
        new_event.value_mask = (uint16_t)client_00->size_hints->max_height;
      }
      else {
        new_event.value_mask = event->height;
      }
    }
    xVar1 = monitor_clamp_client_rect(monitor_00,(xcb_rectangle_t)new_event._20_8_);
    client_00->rect = xVar1;
    new_event._8_8_ = client_00->rect;
    if ((event->value_mask & 0x40) != 0) {
      if (event->sibling != 0) {
        internal_logger(natwm_logger,LEVEL_WARNING,
                        "Specifying stacking order with sibling is not supported yet - Unfortunate behavior may occur."
                       );
      }
      if (event->stack_mode == '\0') {
        workspace_focus_client(state,workspace_00,client_00);
      }
      else if (event->stack_mode == '\x01') {
        workspace_unfocus_client(state,workspace_00,client_00);
      }
      else {
        internal_logger(natwm_logger,LEVEL_WARNING,
                        "Encountered unsupported stacking order - Ignoring");
      }
    }
    handle_configure_request(state->xcb,(xcb_configure_request_event_t *)local_5c);
  }
  handle_configure_request(state->xcb,event);
  return NO_ERROR;
}

Assistant:

enum natwm_error client_configure_window(struct natwm_state *state,
                                         xcb_configure_request_event_t *event)
{
        struct workspace *workspace
                = workspace_list_find_window_workspace(state->workspace_list, event->window);

        if (workspace == NULL) {
                // window is not registered with us - just pass it along
                goto handle_not_registered;
        }

        struct client *client = workspace_find_window_client(workspace, event->window);
        struct monitor *monitor
                = monitor_list_get_workspace_monitor(state->monitor_list, workspace);

        if (client == NULL || monitor == NULL) {
                return RESOLUTION_FAILURE;
        }

        xcb_rectangle_t new_rect = client->rect;
        xcb_configure_request_event_t new_event = *event;

        if (event->value_mask & XCB_CONFIG_WINDOW_X) {
                new_rect.x = event->x;
        }

        if (event->value_mask & XCB_CONFIG_WINDOW_Y) {
                new_rect.y = event->y;
        }

        if (event->value_mask & XCB_CONFIG_WINDOW_WIDTH) {
                if (event->width < client->size_hints->min_width) {
                        new_rect.width = (uint16_t)client->size_hints->min_width;
                } else if (event->width > client->size_hints->max_width) {
                        new_rect.width = (uint16_t)client->size_hints->max_width;
                } else {
                        new_rect.width = event->width;
                }
        }

        if (event->value_mask & XCB_CONFIG_WINDOW_HEIGHT) {
                if (event->height < client->size_hints->min_height) {
                        new_rect.height = (uint16_t)client->size_hints->min_height;
                } else if (event->height > client->size_hints->max_height) {
                        new_rect.height = (uint16_t)client->size_hints->max_height;
                } else {
                        new_rect.height = event->height;
                }
        }

        client->rect = monitor_clamp_client_rect(monitor, new_rect);

        new_event.x = client->rect.x;
        new_event.y = client->rect.y;
        new_event.width = client->rect.width;
        new_event.height = client->rect.height;

        if (event->value_mask & XCB_CONFIG_WINDOW_STACK_MODE) {
                if (event->sibling != XCB_NONE) {
                        LOG_WARNING(natwm_logger,
                                    "Specifying stacking order with sibling is "
                                    "not supported yet - Unfortunate behavior "
                                    "may occur.");
                }

                if (event->stack_mode == XCB_STACK_MODE_ABOVE) {
                        workspace_focus_client(state, workspace, client);

                } else if (event->stack_mode == XCB_STACK_MODE_BELOW) {
                        workspace_unfocus_client(state, workspace, client);
                } else {
                        // TODO: Support XCB_STACK_MODE_{OPPOSITE, TOP_IF,
                        // BOTTOM_IF}
                        LOG_WARNING(natwm_logger,
                                    "Encountered unsupported stacking order - "
                                    "Ignoring");
                }
        }

        handle_configure_request(state->xcb, &new_event);

handle_not_registered:
        handle_configure_request(state->xcb, event);

        return NO_ERROR;
}